

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::DiffuseAreaLight::L
          (DiffuseAreaLight *this,Point3f *p,Normal3f *n,Point2f *uv,Vector3f *w,
          SampledWavelengths *lambda)

{
  undefined8 uVar1;
  array<float,_4> aVar2;
  bool bVar3;
  Float *pFVar4;
  DenselySampledSpectrum *in_RDI;
  Float FVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  SampledSpectrum SVar17;
  Image *unaff_retaddr;
  WrapMode2D in_stack_00000008;
  Tuple2<pbrt::Point2,_float> in_stack_00000010;
  int c;
  RGB rgb;
  undefined4 in_stack_ffffffffffffff28;
  Float in_stack_ffffffffffffff2c;
  undefined4 uVar18;
  SampledSpectrum *in_stack_ffffffffffffff30;
  WrapMode in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  SampledWavelengths *in_stack_ffffffffffffff68;
  RGBSpectrum *in_stack_ffffffffffffff70;
  RGB *in_stack_ffffffffffffff90;
  RGBColorSpace *in_stack_ffffffffffffff98;
  RGBSpectrum *in_stack_ffffffffffffffa0;
  int local_50;
  RGB local_4c [5];
  undefined8 local_10;
  undefined4 local_8;
  float in_stack_fffffffffffffffc;
  undefined1 extraout_var [60];
  undefined1 auVar11 [56];
  undefined1 auVar16 [56];
  
  if (((ulong)in_RDI[5].values.alloc.memoryResource & 1) == 0) {
    auVar6._0_4_ = Dot<float>((Normal3<float> *)in_stack_ffffffffffffff30,
                              (Vector3<float> *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    auVar6._4_60_ = extraout_var;
    in_ZMM1 = ZEXT1664(auVar6._0_16_);
    if (auVar6._0_4_ < 0.0) {
      SampledSpectrum::SampledSpectrum(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      goto LAB_005343b9;
    }
  }
  FVar5 = (Float)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  bVar3 = Image::operator_cast_to_bool((Image *)&in_RDI[5].values.nAlloc);
  auVar16 = in_ZMM1._8_56_;
  if (bVar3) {
    RGB::RGB(local_4c);
    for (local_50 = 0; auVar16 = in_ZMM1._8_56_, local_50 < 3; local_50 = local_50 + 1) {
      WrapMode2D::WrapMode2D((WrapMode2D *)&in_RDI[5].values.nAlloc,in_stack_ffffffffffffff3c);
      FVar5 = Image::BilerpChannel
                        (unaff_retaddr,(Point2f)in_stack_00000010,(int)in_stack_fffffffffffffffc,
                         in_stack_00000008);
      pFVar4 = RGB::operator[](local_4c,local_50);
      *pFVar4 = FVar5;
    }
    auVar11 = (undefined1  [56])0x0;
    FVar5 = (Float)((ulong)&stack0xffffffffffffff68 >> 0x20);
    RGBSpectrum::RGBSpectrum
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    SVar17 = RGBSpectrum::Sample(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    auVar12._0_8_ = SVar17.values.values._8_8_;
    auVar12._8_56_ = auVar16;
    auVar7._0_8_ = SVar17.values.values._0_8_;
    auVar7._8_56_ = auVar11;
    auVar11 = (undefined1  [56])0x0;
    vmovlpd_avx(auVar7._0_16_);
    vmovlpd_avx(auVar12._0_16_);
    SVar17 = pbrt::operator*(FVar5,(SampledSpectrum *)
                                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    auVar13._0_8_ = SVar17.values.values._8_8_;
    auVar13._8_56_ = auVar16;
    auVar8._0_8_ = SVar17.values.values._0_8_;
    auVar8._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar8._0_16_);
    uVar1 = vmovlpd_avx(auVar13._0_16_);
    local_8 = (undefined4)uVar1;
    in_stack_fffffffffffffffc = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    uVar18 = (undefined4)in_RDI[4].values.nStored;
    auVar11 = (undefined1  [56])0x0;
    SVar17 = DenselySampledSpectrum::Sample
                       (in_RDI,(SampledWavelengths *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    auVar14._0_8_ = SVar17.values.values._8_8_;
    auVar14._8_56_ = auVar16;
    auVar9._0_8_ = SVar17.values.values._0_8_;
    auVar9._8_56_ = auVar11;
    auVar11 = (undefined1  [56])0x0;
    vmovlpd_avx(auVar9._0_16_);
    vmovlpd_avx(auVar14._0_16_);
    SVar17 = pbrt::operator*(FVar5,(SampledSpectrum *)CONCAT44(uVar18,in_stack_ffffffffffffff28));
    auVar15._0_8_ = SVar17.values.values._8_8_;
    auVar15._8_56_ = auVar16;
    auVar10._0_8_ = SVar17.values.values._0_8_;
    auVar10._8_56_ = auVar11;
    local_10 = vmovlpd_avx(auVar10._0_16_);
    uVar1 = vmovlpd_avx(auVar15._0_16_);
    local_8 = (undefined4)uVar1;
    in_stack_fffffffffffffffc = (float)((ulong)uVar1 >> 0x20);
  }
LAB_005343b9:
  aVar2.values[2] = (float)local_8;
  aVar2.values[0] = (float)(undefined4)local_10;
  aVar2.values[1] = (float)local_10._4_4_;
  aVar2.values[3] = in_stack_fffffffffffffffc;
  return (array<float,_4>)(array<float,_4>)aVar2.values;
}

Assistant:

L(const Point3f &p, const Normal3f &n, const Point2f &uv,
                      const Vector3f &w, const SampledWavelengths &lambda) const {
        if (!twoSided && Dot(n, w) < 0)
            return SampledSpectrum(0.f);

        if (image) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.BilerpChannel(uv, c);
            return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
        } else
            return scale * Lemit.Sample(lambda);
    }